

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

int32_t __thiscall
icu_63::MessagePattern::parseSimpleStyle
          (MessagePattern *this,int32_t index,UParseError *parseError,UErrorCode *errorCode)

{
  short sVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  char16_t cVar5;
  char16_t *pcVar6;
  int iVar7;
  uint start;
  uint uVar8;
  
  uVar8 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar7 = 0;
    uVar3 = index;
    uVar8 = 0;
    do {
      sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar4 = (this->msg).fUnion.fFields.fLength;
      }
      else {
        uVar4 = (int)sVar1 >> 5;
      }
      if ((int)uVar4 <= (int)uVar3) {
        setParseError(this,parseError,0);
        *errorCode = U_UNMATCHED_BRACES;
        return 0;
      }
      cVar5 = L'\xffff';
      if (uVar3 < uVar4) {
        pcVar6 = (char16_t *)((long)&(this->msg).fUnion + 2);
        if (((int)sVar1 & 2U) == 0) {
          pcVar6 = (this->msg).fUnion.fFields.fArray;
        }
        cVar5 = pcVar6[(int)uVar3];
      }
      start = uVar3 + 1;
      bVar2 = true;
      if (cVar5 == L'}') {
        if (iVar7 < 1) {
          if ((int)(uVar3 - index) < 0x10000) {
            bVar2 = false;
            addPart(this,UMSGPAT_PART_TYPE_ARG_STYLE,index,uVar3 - index,0,errorCode);
            start = uVar3;
            uVar8 = uVar3;
          }
          else {
            setParseError(this,parseError,index);
            *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
LAB_00293d0f:
            bVar2 = false;
            start = uVar3;
            uVar8 = 0;
          }
        }
        else {
          iVar7 = iVar7 + -1;
        }
      }
      else if (cVar5 == L'{') {
        iVar7 = iVar7 + 1;
      }
      else if (cVar5 == L'\'') {
        if ((int)uVar4 < (int)start) {
          start = uVar4;
        }
        if ((int)uVar3 < -1) {
          start = 0;
        }
        uVar3 = UnicodeString::doIndexOf(&this->msg,L'\'',start,uVar4 - start);
        if ((int)uVar3 < 0) {
          setParseError(this,parseError,index);
          *errorCode = U_PATTERN_SYNTAX_ERROR;
          goto LAB_00293d0f;
        }
        start = uVar3 + 1;
      }
      uVar3 = start;
    } while (bVar2);
  }
  return uVar8;
}

Assistant:

int32_t
MessagePattern::parseSimpleStyle(int32_t index, UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t start=index;
    int32_t nestedBraces=0;
    while(index<msg.length()) {
        UChar c=msg.charAt(index++);
        if(c==u_apos) {
            // Treat apostrophe as quoting but include it in the style part.
            // Find the end of the quoted literal text.
            index=msg.indexOf(u_apos, index);
            if(index<0) {
                // Quoted literal argument style text reaches to the end of the message.
                setParseError(parseError, start);
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            // skip the quote-ending apostrophe
            ++index;
        } else if(c==u_leftCurlyBrace) {
            ++nestedBraces;
        } else if(c==u_rightCurlyBrace) {
            if(nestedBraces>0) {
                --nestedBraces;
            } else {
                int32_t length=--index-start;
                if(length>Part::MAX_LENGTH) {
                    setParseError(parseError, start);  // Argument style text too long.
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
                addPart(UMSGPAT_PART_TYPE_ARG_STYLE, start, length, 0, errorCode);
                return index;
            }
        }  // c is part of literal text
    }
    setParseError(parseError, 0);  // Unmatched '{' braces in message.
    errorCode=U_UNMATCHED_BRACES;
    return 0;
}